

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O2

double categ_gain<unsigned_long,double>
                 (unsigned_long cnt_left,unsigned_long cnt_right,double s_left,double s_right,
                 double base_info,double cnt)

{
  double dVar1;
  double __x;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  double dVar4;
  
  dVar4 = 0.0;
  if (1 < cnt_left) {
    auVar2._8_4_ = (int)(cnt_left >> 0x20);
    auVar2._0_8_ = cnt_left;
    auVar2._12_4_ = 0x45300000;
    dVar1 = (auVar2._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)cnt_left) - 4503599627370496.0);
    dVar4 = log(dVar1);
    dVar4 = dVar4 * dVar1;
  }
  dVar1 = 0.0;
  if (1 < cnt_right) {
    auVar3._8_4_ = (int)(cnt_right >> 0x20);
    auVar3._0_8_ = cnt_right;
    auVar3._12_4_ = 0x45300000;
    __x = (auVar3._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)cnt_right) - 4503599627370496.0);
    dVar1 = log(__x);
    dVar1 = dVar1 * __x;
  }
  return ((base_info - (dVar4 - s_left)) - (dVar1 - s_right)) / cnt;
}

Assistant:

double categ_gain(number cnt_left, number cnt_right,
                  ldouble_safe s_left, ldouble_safe s_right,
                  ldouble_safe base_info, ldouble_safe cnt)
{
    return (
            base_info -
            (((cnt_left  <= 1)? 0 : ((ldouble_safe)cnt_left  * std::log((ldouble_safe)cnt_left)))  - s_left) -
            (((cnt_right <= 1)? 0 : ((ldouble_safe)cnt_right * std::log((ldouble_safe)cnt_right))) - s_right)
            ) / cnt;
}